

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void Commands::HideImpl(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from,bool set)

{
  Character *pCVar1;
  bool bVar2;
  int iVar3;
  const_reference subject;
  undefined4 extraout_var;
  allocator local_f9;
  int explicit_flags;
  string local_d8;
  reference local_b8;
  _Hash_node<std::pair<const_IPAddress,_double>,_true> *flag;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  iterator __end1;
  iterator __begin1;
  allocator local_61;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int flags;
  bool set_local;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  __range1._0_4_ = 0;
  __range1._7_1_ = set;
  _flags = from;
  from_local = (Character *)arguments;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,",",&local_61);
  subject = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)from_local,0);
  util::lowercase((string *)&__begin1,subject);
  util::explode(&local_40,&local_60,(string *)&__begin1);
  std::__cxx11::string::~string((string *)&__begin1);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_28 = &local_40;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_28);
  local_a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(local_28);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end1,&local_a8);
    if (!bVar2) {
      flag._4_4_ = 2;
LAB_00315493:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_40);
      if (flag._4_4_ != 1) {
        if ((__range1._7_1_ & 1) == 0) {
          Character::Unhide(_flags,(uint)__range1);
        }
        else {
          Character::Hide(_flags,(uint)__range1);
        }
      }
      return;
    }
    local_b8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"invisible");
    if (bVar2) {
      __range1._0_4_ = (uint)__range1 | 1;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"online");
      if (bVar2) {
        __range1._0_4_ = (uint)__range1 | 2;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"npc");
        if (bVar2) {
          __range1._0_4_ = (uint)__range1 | 4;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"admin");
          if (bVar2) {
            __range1._0_4_ = (uint)__range1 | 8;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"warp");
            if (bVar2) {
              __range1._0_4_ = (uint)__range1 | 0x10;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"all");
              pCVar1 = _flags;
              if (!bVar2) {
                iVar3 = (*(_flags->super_Command_Source)._vptr_Command_Source[4])();
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&explicit_flags,"invalid_hide_flag",&local_f9);
                I18N::Format<>(&local_d8,(I18N *)(CONCAT44(extraout_var,iVar3) + 0x458),
                               (string *)&explicit_flags);
                (*(pCVar1->super_Command_Source)._vptr_Command_Source[5])(pCVar1,&local_d8);
                std::__cxx11::string::~string((string *)&local_d8);
                std::__cxx11::string::~string((string *)&explicit_flags);
                std::allocator<char>::~allocator((allocator<char> *)&local_f9);
                flag._4_4_ = 1;
                goto LAB_00315493;
              }
              __range1._0_4_ = (uint)__range1 | 0x1f;
            }
          }
        }
      }
    }
    __range1._0_4_ = ((uint)__range1 & 0xfffffffe) << 0x10 | (uint)__range1;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void HideImpl(const std::vector<std::string>& arguments, Character* from, bool set)
{
	int flags = 0;

	for (const auto& flag : util::explode(",", util::lowercase(arguments[0])))
	{
		     if (flag == "invisible") flags |= Character::HideInvisible;
		else if (flag == "online")    flags |= Character::HideOnline;
		else if (flag == "npc")       flags |= Character::HideNpc;
		else if (flag == "admin")     flags |= Character::HideAdmin;
		else if (flag == "warp")      flags |= Character::HideWarp;
		else if (flag == "all")       flags |= Character::HideAll;
		else
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_hide_flag"));
			return;
		}

		int explicit_flags = (flags & ~Character::HideInvisible) << 16;
		flags |= explicit_flags;
	}

	if (set)
		from->Hide(flags);
	else
		from->Unhide(flags);
}